

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationElementIterator::next(CollationElementIterator *this,UErrorCode *status)

{
  UBool UVar1;
  uint32_t uVar2;
  int64_t iVar3;
  uint32_t secondHalf;
  uint32_t firstHalf;
  uint32_t lower32;
  uint32_t p;
  int64_t ce;
  uint32_t oh;
  UErrorCode *status_local;
  CollationElementIterator *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->dir_ < '\x02') {
      if (this->dir_ == '\x01') {
        this->dir_ = '\x02';
      }
      else {
        if (this->dir_ != '\0') {
          *status = U_INVALID_STATE_ERROR;
          return -1;
        }
        this->dir_ = '\x02';
      }
    }
    else if (this->otherHalf_ != 0) {
      uVar2 = this->otherHalf_;
      this->otherHalf_ = 0;
      return uVar2;
    }
    CollationIterator::clearCEsIfNoneRemaining(this->iter_);
    iVar3 = CollationIterator::nextCE(this->iter_,status);
    if (iVar3 == 0x101000100) {
      this_local._4_4_ = 0xffffffff;
    }
    else {
      uVar2 = (uint32_t)((ulong)iVar3 >> 0x20);
      this_local._4_4_ = anon_unknown_16::getFirstHalf(uVar2,(uint32_t)iVar3);
      uVar2 = anon_unknown_16::getSecondHalf(uVar2,(uint32_t)iVar3);
      if (uVar2 != 0) {
        this->otherHalf_ = uVar2 | 0xc0;
      }
    }
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

int32_t CollationElementIterator::next(UErrorCode& status)
{
    if (U_FAILURE(status)) { return NULLORDER; }
    if (dir_ > 1) {
        // Continue forward iteration. Test this first.
        if (otherHalf_ != 0) {
            uint32_t oh = otherHalf_;
            otherHalf_ = 0;
            return oh;
        }
    } else if (dir_ == 1) {
        // next() after setOffset()
        dir_ = 2;
    } else if (dir_ == 0) {
        // The iter_ is already reset to the start of the text.
        dir_ = 2;
    } else /* dir_ < 0 */ {
        // illegal change of direction
        status = U_INVALID_STATE_ERROR;
        return NULLORDER;
    }
    // No need to keep all CEs in the buffer when we iterate.
    iter_->clearCEsIfNoneRemaining();
    int64_t ce = iter_->nextCE(status);
    if (ce == Collation::NO_CE) { return NULLORDER; }
    // Turn the 64-bit CE into two old-style 32-bit CEs, without quaternary bits.
    uint32_t p = (uint32_t)(ce >> 32);
    uint32_t lower32 = (uint32_t)ce;
    uint32_t firstHalf = getFirstHalf(p, lower32);
    uint32_t secondHalf = getSecondHalf(p, lower32);
    if (secondHalf != 0) {
        otherHalf_ = secondHalf | 0xc0;  // continuation CE
    }
    return firstHalf;
}